

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O3

void __thiscall
cbtHashMap<cbtHashPtr,_cbtCollisionObject_*>::insert
          (cbtHashMap<cbtHashPtr,_cbtCollisionObject_*> *this,cbtHashPtr *key,
          cbtCollisionObject **value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  cbtCollisionObject **ptr;
  cbtHashPtr *ptr_00;
  int *piVar4;
  int iVar5;
  uint uVar6;
  cbtCollisionObject **ppcVar7;
  cbtHashPtr *pcVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  
  uVar9 = (key->field_0).m_hashValues[0];
  uVar1 = (key->field_0).m_hashValues[1];
  iVar11 = (this->m_valueArray).m_capacity;
  iVar5 = findIndex(this,key);
  if (iVar5 == -1) {
    uVar2 = (this->m_valueArray).m_size;
    uVar3 = (this->m_valueArray).m_capacity;
    uVar6 = uVar2;
    if (uVar2 == uVar3) {
      iVar5 = 1;
      if (uVar2 != 0) {
        iVar5 = uVar2 * 2;
      }
      if ((int)uVar2 < iVar5) {
        if (iVar5 == 0) {
          ppcVar7 = (cbtCollisionObject **)0x0;
        }
        else {
          ppcVar7 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar5 << 3,0x10);
          uVar6 = (this->m_valueArray).m_size;
        }
        if (0 < (int)uVar6) {
          uVar10 = 0;
          do {
            ppcVar7[uVar10] = (this->m_valueArray).m_data[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar6 != uVar10);
        }
        ptr = (this->m_valueArray).m_data;
        if ((ptr != (cbtCollisionObject **)0x0) && ((this->m_valueArray).m_ownsMemory == true)) {
          cbtAlignedFreeInternal(ptr);
          uVar6 = (this->m_valueArray).m_size;
        }
        (this->m_valueArray).m_ownsMemory = true;
        (this->m_valueArray).m_data = ppcVar7;
        (this->m_valueArray).m_capacity = iVar5;
      }
    }
    (this->m_valueArray).m_data[(int)uVar6] = *value;
    (this->m_valueArray).m_size = uVar6 + 1;
    uVar6 = (this->m_keyArray).m_size;
    if (uVar6 == (this->m_keyArray).m_capacity) {
      iVar5 = 1;
      if (uVar6 != 0) {
        iVar5 = uVar6 * 2;
      }
      if ((int)uVar6 < iVar5) {
        if (iVar5 == 0) {
          pcVar8 = (cbtHashPtr *)0x0;
        }
        else {
          pcVar8 = (cbtHashPtr *)cbtAlignedAllocInternal((long)iVar5 << 3,0x10);
          uVar6 = (this->m_keyArray).m_size;
        }
        if (0 < (int)uVar6) {
          uVar10 = 0;
          do {
            pcVar8[uVar10].field_0 = (this->m_keyArray).m_data[uVar10].field_0;
            uVar10 = uVar10 + 1;
          } while (uVar6 != uVar10);
        }
        ptr_00 = (this->m_keyArray).m_data;
        if ((ptr_00 != (cbtHashPtr *)0x0) && ((this->m_keyArray).m_ownsMemory == true)) {
          cbtAlignedFreeInternal(ptr_00);
        }
        (this->m_keyArray).m_ownsMemory = true;
        (this->m_keyArray).m_data = pcVar8;
        (this->m_keyArray).m_capacity = iVar5;
        uVar6 = (this->m_keyArray).m_size;
      }
    }
    (this->m_keyArray).m_data[(int)uVar6].field_0 = key->field_0;
    piVar4 = &(this->m_keyArray).m_size;
    *piVar4 = *piVar4 + 1;
    if ((int)uVar3 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      iVar11 = (this->m_valueArray).m_capacity;
      iVar5 = (key->field_0).m_hashValues[1] + (key->field_0).m_hashValues[0];
      uVar9 = ~(iVar5 * 0x8000) + iVar5;
      uVar9 = uVar9 >> 10 ^ uVar9;
    }
    else {
      iVar5 = uVar1 + uVar9;
      uVar9 = ~(iVar5 * 0x8000) + iVar5;
      uVar9 = uVar9 >> 10 ^ uVar9;
    }
    uVar9 = uVar9 * 9 >> 6 ^ uVar9 * 9;
    uVar9 = ~(uVar9 << 0xb) + uVar9;
    piVar4 = (this->m_hashTable).m_data;
    uVar9 = iVar11 - 1U & (uVar9 >> 0x10 ^ uVar9);
    (this->m_next).m_data[(int)uVar2] = piVar4[(int)uVar9];
    piVar4[(int)uVar9] = uVar2;
  }
  else {
    (this->m_valueArray).m_data[iVar5] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		int hash = key.getHash() & (m_valueArray.capacity() - 1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index] = value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity() - 1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}